

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O1

Abc_Obj_t * Abc_NtkCovDerive_rec(Cov_Man_t *p,Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  long *plVar1;
  Vec_Int_t *vSupp;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  Min_Cube_t *pCube_11;
  Min_Cube_t *pMVar4;
  Abc_Obj_t *pObj_00;
  Vec_Str_t *vCover;
  char *pcVar5;
  Min_Cube_t *pCube_9;
  Min_Cube_t *pMVar6;
  uint uVar7;
  Min_Cube_t *pMVar8;
  long lVar9;
  uint uVar10;
  Min_Cube_t *pMVar11;
  undefined8 uStack_38;
  
  if ((Abc_Obj_t *)(pObj->field_6).pTemp != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pObj->field_6).pTemp;
  }
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covBuild.c"
                  ,0x197,"Abc_Obj_t *Abc_NtkCovDerive_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *)");
  }
  iVar3 = pObj->Id;
  if (((long)iVar3 < 0) ||
     (lVar9 = *(long *)((long)pObj->pNtk->pManCut + 0x18), *(int *)(lVar9 + 4) <= iVar3)) {
LAB_008b3978:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  plVar1 = *(long **)(*(long *)(lVar9 + 8) + (long)iVar3 * 8);
  vSupp = (Vec_Int_t *)plVar1[3];
  if (vSupp == (Vec_Int_t *)0x0) {
    __assert_fail("vSupp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covBuild.c"
                  ,0x19a,"Abc_Obj_t *Abc_NtkCovDerive_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pMVar6 = (Min_Cube_t *)*plVar1;
  pMVar4 = (Min_Cube_t *)plVar1[1];
  pMVar8 = (Min_Cube_t *)plVar1[2];
  if (pMVar6 != (Min_Cube_t *)0x0) {
    if (pMVar4 != (Min_Cube_t *)0x0) {
      uVar7 = 0xffffffff;
      pMVar11 = pMVar6;
      do {
        pMVar11 = pMVar11->pNext;
        uVar7 = uVar7 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      uVar10 = 0xffffffff;
      pMVar11 = pMVar4;
      do {
        pMVar11 = pMVar11->pNext;
        uVar10 = uVar10 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      if (uVar10 < uVar7) goto LAB_008b370e;
    }
    if (pMVar8 != (Min_Cube_t *)0x0) {
      uVar7 = 0xffffffff;
      pMVar11 = pMVar6;
      do {
        pMVar11 = pMVar11->pNext;
        uVar7 = uVar7 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      uVar10 = 0xffffffff;
      pMVar11 = pMVar8;
      do {
        pMVar11 = pMVar11->pNext;
        uVar10 = uVar10 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      if (uVar10 < uVar7) goto LAB_008b370e;
    }
    uStack_38 = 0x31000000;
    goto LAB_008b381b;
  }
LAB_008b370e:
  if (pMVar4 == (Min_Cube_t *)0x0) {
LAB_008b377d:
    if (pMVar8 == (Min_Cube_t *)0x0) {
LAB_008b37e3:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covBuild.c"
                    ,0x1ba,"Abc_Obj_t *Abc_NtkCovDerive_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *)")
      ;
    }
    if (pMVar6 != (Min_Cube_t *)0x0) {
      uVar7 = 0xffffffff;
      pMVar11 = pMVar8;
      do {
        pMVar11 = pMVar11->pNext;
        uVar7 = uVar7 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      uVar10 = 0xffffffff;
      do {
        pMVar6 = pMVar6->pNext;
        uVar10 = uVar10 + 1;
      } while (pMVar6 != (Min_Cube_t *)0x0);
      if (uVar10 <= uVar7) goto LAB_008b37e3;
    }
    pMVar6 = pMVar8;
    if (pMVar4 == (Min_Cube_t *)0x0) {
      uStack_38 = 0x78000000;
    }
    else {
      uVar7 = 0xffffffff;
      do {
        pMVar8 = pMVar8->pNext;
        uVar7 = uVar7 + 1;
      } while (pMVar8 != (Min_Cube_t *)0x0);
      uVar10 = 0xffffffff;
      do {
        pMVar4 = pMVar4->pNext;
        uVar10 = uVar10 + 1;
      } while (pMVar4 != (Min_Cube_t *)0x0);
      uStack_38 = 0x78000000;
      if (uVar10 <= uVar7) goto LAB_008b37e3;
    }
  }
  else {
    if (pMVar6 != (Min_Cube_t *)0x0) {
      uVar7 = 0xffffffff;
      pMVar11 = pMVar4;
      do {
        pMVar11 = pMVar11->pNext;
        uVar7 = uVar7 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      uVar10 = 0xffffffff;
      pMVar11 = pMVar6;
      do {
        pMVar11 = pMVar11->pNext;
        uVar10 = uVar10 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      if (uVar10 < uVar7) goto LAB_008b377d;
    }
    if (pMVar8 != (Min_Cube_t *)0x0) {
      uVar7 = 0xffffffff;
      pMVar11 = pMVar4;
      do {
        pMVar11 = pMVar11->pNext;
        uVar7 = uVar7 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      uVar10 = 0xffffffff;
      pMVar11 = pMVar8;
      do {
        pMVar11 = pMVar11->pNext;
        uVar10 = uVar10 + 1;
      } while (pMVar11 != (Min_Cube_t *)0x0);
      if (uVar10 < uVar7) goto LAB_008b377d;
    }
    uStack_38 = 0x130000000;
    pMVar6 = pMVar4;
  }
LAB_008b381b:
  if (0 < vSupp->nSize) {
    lVar9 = 0;
    do {
      iVar3 = vSupp->pArray[lVar9];
      if (((long)iVar3 < 0) || (pVVar2 = pObj->pNtk->vObjs, pVVar2->nSize <= iVar3))
      goto LAB_008b3978;
      Abc_NtkCovDerive_rec(p,pNtkNew,(Abc_Obj_t *)pVVar2->pArray[iVar3]);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vSupp->nSize);
  }
  iVar3 = 1;
  pMVar4 = pMVar6;
  do {
    pMVar4 = pMVar4->pNext;
    iVar3 = iVar3 + -1;
  } while (pMVar4 != (Min_Cube_t *)0x0);
  if (iVar3 == 0) {
    pObj_00 = Abc_NtkCovDeriveCube(pNtkNew,pObj,pMVar6,vSupp,uStack_38._4_4_);
  }
  else {
    pObj_00 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
    if (0 < vSupp->nSize) {
      lVar9 = 0;
      do {
        iVar3 = vSupp->pArray[lVar9];
        if (((long)iVar3 < 0) || (pVVar2 = pObj->pNtk->vObjs, pVVar2->nSize <= iVar3))
        goto LAB_008b3978;
        Abc_ObjAddFanin(pObj_00,*(Abc_Obj_t **)((long)pVVar2->pArray[iVar3] + 0x40));
        lVar9 = lVar9 + 1;
      } while (lVar9 < vSupp->nSize);
    }
    vCover = (Vec_Str_t *)malloc(0x10);
    vCover->nCap = 100;
    vCover->nSize = 0;
    pcVar5 = (char *)malloc(100);
    vCover->pArray = pcVar5;
    Min_CoverCreate(vCover,pMVar6,uStack_38._3_1_);
    pcVar5 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,vCover->pArray);
    (pObj_00->field_5).pData = pcVar5;
    if (vCover->pArray != (char *)0x0) {
      free(vCover->pArray);
      vCover->pArray = (char *)0x0;
    }
    free(vCover);
  }
  (pObj->field_6).pCopy = pObj_00;
  return pObj_00;
}

Assistant:

Abc_Obj_t * Abc_NtkCovDerive_rec( Cov_Man_t * p, Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    int fVerbose = 0;
    Min_Cube_t * pCover, * pCovers[3];
    Abc_Obj_t * pNodeNew, * pFanin;
    Vec_Int_t * vSupp;
    Vec_Str_t * vCover;
    int i, Entry, nCubes, Type = 0;
    // skip if already computed
    if ( pObj->pCopy )
        return pObj->pCopy;
    assert( Abc_ObjIsNode(pObj) );
    // get the support and the cover
    vSupp  = Abc_ObjGetSupp( pObj ); 
    assert( vSupp );
    // choose the cover to implement
    pCovers[0] = Abc_ObjGetCover( pObj, 0 );
    pCovers[1] = Abc_ObjGetCover( pObj, 1 );
    pCovers[2] = Abc_ObjGetCover2( pObj );
    // use positive polarity
    if ( pCovers[0] 
        && (!pCovers[1] || Min_CoverCountCubes(pCovers[0]) <= Min_CoverCountCubes(pCovers[1]))
        && (!pCovers[2] || Min_CoverCountCubes(pCovers[0]) <= Min_CoverCountCubes(pCovers[2]))   )
    {
        pCover = pCovers[0];
        Type = '1';
    }
    else 
    // use negative polarity
    if ( pCovers[1] 
        && (!pCovers[0] || Min_CoverCountCubes(pCovers[1]) <= Min_CoverCountCubes(pCovers[0]))
        && (!pCovers[2] || Min_CoverCountCubes(pCovers[1]) <= Min_CoverCountCubes(pCovers[2]))   )
    {
        pCover = pCovers[1];
        Type = '0';
    }
    else 
    // use XOR polarity
    if ( pCovers[2] 
        && (!pCovers[0] || Min_CoverCountCubes(pCovers[2]) < Min_CoverCountCubes(pCovers[0]))
        && (!pCovers[1] || Min_CoverCountCubes(pCovers[2]) < Min_CoverCountCubes(pCovers[1]))   )
    {
        pCover = pCovers[2];
        Type = 'x';
    }
    else
        assert( 0 );
    // print the support of this node
    if ( fVerbose )
    {
        printf( "{ " );
        Vec_IntForEachEntry( vSupp, Entry, i )
            printf( "%d ", Entry );
        printf( "}  cubes = %d\n", Min_CoverCountCubes( pCover ) );
    }
    // process the fanins
    Vec_IntForEachEntry( vSupp, Entry, i )
    {
        pFanin = Abc_NtkObj(pObj->pNtk, Entry);
        Abc_NtkCovDerive_rec( p, pNtkNew, pFanin );
    }
    // for each cube, construct the node
    nCubes = Min_CoverCountCubes( pCover );
    if ( nCubes == 0 )
        pNodeNew = Abc_NtkCreateNodeConst0(pNtkNew);
    else if ( nCubes == 1 )
        pNodeNew = Abc_NtkCovDeriveCube( pNtkNew, pObj, pCover, vSupp, Type == '0' );
    else
    {
        // create the node
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        Vec_IntForEachEntry( vSupp, Entry, i )
        {
            pFanin = Abc_NtkObj(pObj->pNtk, Entry);
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        }
        // derive the function
        vCover = Vec_StrAlloc( 100 );
        Min_CoverCreate( vCover, pCover, (char)Type );
        pNodeNew->pData = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc, Vec_StrArray(vCover) );
        Vec_StrFree( vCover );
    }

/*
    printf( "Created node %d(%d) at level %d: ", pNodeNew->Id, pObj->Id, Level );
    Vec_IntForEachEntry( vSupp, Entry, i )
    {
        pFanin = Abc_NtkObj(pObj->pNtk, Entry);
        printf( "%d(%d) ", pFanin->pCopy->Id, pFanin->Id );
    }
    printf( "\n" );
    Min_CoverWrite( stdout, pCover );
*/
    return pObj->pCopy = pNodeNew;
}